

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polymer.cpp
# Opt level: O2

bool __thiscall Polymer::CheckPolCollisions(Polymer *this,int pol_index)

{
  runtime_error *this_00;
  int index;
  bool bVar1;
  Ptr next_pol;
  Ptr this_pol;
  string local_300;
  string local_2e0;
  string local_2c0;
  string local_2a0;
  string local_280;
  string local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string err;
  
  index = (int)this + 0x90;
  MobileElementManager::GetPol((MobileElementManager *)&this_pol,index);
  if ((ulong)(long)(pol_index + 1) <
      (ulong)((long)(this->polymerases_).polymerases_.
                    super__Vector_base<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>,_std::allocator<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->polymerases_).polymerases_.
                    super__Vector_base<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>,_std::allocator<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5)) {
    MobileElementManager::GetPol((MobileElementManager *)&next_pol,index);
    if (((this_pol.super___shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->stop_ <
         (next_pol.super___shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->start_) ||
       ((next_pol.super___shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->stop_ <
        (this_pol.super___shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->start_)) {
      bVar1 = false;
    }
    else {
      bVar1 = true;
      if (3 < (this_pol.super___shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->stop_
              - (next_pol.super___shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                start_) {
        std::operator+(&local_240,"Polymerase ",
                       &(this_pol.super___shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr)->name_);
        std::operator+(&local_220,&local_240," (start: ");
        std::__cxx11::to_string
                  (&local_260,
                   (this_pol.super___shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                   start_);
        std::operator+(&local_200,&local_220,&local_260);
        std::operator+(&local_1e0,&local_200,", stop: ");
        std::__cxx11::to_string
                  (&local_280,
                   (this_pol.super___shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                   stop_);
        std::operator+(&local_1c0,&local_1e0,&local_280);
        std::operator+(&local_1a0,&local_1c0,", index: ");
        std::__cxx11::to_string(&local_2a0,pol_index);
        std::operator+(&local_180,&local_1a0,&local_2a0);
        std::operator+(&local_160,&local_180,") is overlapping polymerase ");
        std::operator+(&local_140,&local_160,
                       &(next_pol.super___shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr)->name_);
        std::operator+(&local_120,&local_140," (start: ");
        std::__cxx11::to_string
                  (&local_2c0,
                   (next_pol.super___shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                   start_);
        std::operator+(&local_100,&local_120,&local_2c0);
        std::operator+(&local_e0,&local_100,", stop: ");
        std::__cxx11::to_string
                  (&local_2e0,
                   (next_pol.super___shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                   stop_);
        std::operator+(&local_c0,&local_e0,&local_2e0);
        std::operator+(&local_a0,&local_c0,", index: ");
        std::__cxx11::to_string(&local_300,pol_index + 1);
        std::operator+(&local_80,&local_a0,&local_300);
        std::operator+(&local_60,&local_80,") by more than one position on polymer ");
        std::operator+(&err,&local_60,&this->name_);
        std::__cxx11::string::~string((string *)&local_60);
        std::__cxx11::string::~string((string *)&local_80);
        std::__cxx11::string::~string((string *)&local_300);
        std::__cxx11::string::~string((string *)&local_a0);
        std::__cxx11::string::~string((string *)&local_c0);
        std::__cxx11::string::~string((string *)&local_2e0);
        std::__cxx11::string::~string((string *)&local_e0);
        std::__cxx11::string::~string((string *)&local_100);
        std::__cxx11::string::~string((string *)&local_2c0);
        std::__cxx11::string::~string((string *)&local_120);
        std::__cxx11::string::~string((string *)&local_140);
        std::__cxx11::string::~string((string *)&local_160);
        std::__cxx11::string::~string((string *)&local_180);
        std::__cxx11::string::~string((string *)&local_2a0);
        std::__cxx11::string::~string((string *)&local_1a0);
        std::__cxx11::string::~string((string *)&local_1c0);
        std::__cxx11::string::~string((string *)&local_280);
        std::__cxx11::string::~string((string *)&local_1e0);
        std::__cxx11::string::~string((string *)&local_200);
        std::__cxx11::string::~string((string *)&local_260);
        std::__cxx11::string::~string((string *)&local_220);
        std::__cxx11::string::~string((string *)&local_240);
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_00,(string *)&err);
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&next_pol.super___shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  else {
    bVar1 = false;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&this_pol.super___shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return bVar1;
}

Assistant:

bool Polymer::CheckPolCollisions(int pol_index) {
  auto this_pol = polymerases_.GetPol(pol_index);
  if (!polymerases_.ValidIndex(pol_index + 1)) {
    // Are there any polymerases ahead of this one?
    return false;
  }
  auto next_pol = polymerases_.GetPol(pol_index + 1);
  // We only need to check the polymerase one position ahead of this
  // polymerase
  if ((this_pol->stop() >= next_pol->start()) &&
      (next_pol->stop() >= this_pol->start())) {
    // Error checking. TODO: Can this be removed?
    if (this_pol->stop() - next_pol->start() > 3) {
      std::string err = "Polymerase " + this_pol->name() +
                        " (start: " + std::to_string(this_pol->start()) +
                        ", stop: " + std::to_string(this_pol->stop()) +
                        ", index: " + std::to_string(pol_index) +
                        ") is overlapping polymerase " + next_pol->name() +
                        " (start: " + std::to_string(next_pol->start()) +
                        ", stop: " + std::to_string(next_pol->stop()) +
                        ", index: " + std::to_string(pol_index + 1) +
                        ") by more than one position on polymer " + name_;
      throw std::runtime_error(err);
    }
    return true;
  }
  return false;
}